

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O1

void __thiscall
testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  UnitTest *pUVar1;
  TestPartResultReporterInterface *pTVar2;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_00163cb0;
  this->has_new_fatal_failure_ = false;
  pUVar1 = UnitTest::GetInstance();
  pTVar2 = UnitTestImpl::GetTestPartResultReporterForCurrentThread(pUVar1->impl_);
  this->original_reporter_ = pTVar2;
  pUVar1 = UnitTest::GetInstance();
  UnitTestImpl::SetTestPartResultReporterForCurrentThread
            (pUVar1->impl_,&this->super_TestPartResultReporterInterface);
  return;
}

Assistant:

HasNewFatalFailureHelper::HasNewFatalFailureHelper()
    : has_new_fatal_failure_(false),
      original_reporter_(
          GetUnitTestImpl()->GetTestPartResultReporterForCurrentThread()) {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(this);
}